

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  VkBufferView obj_00;
  Unique<vk::Handle<(vk::HandleType)12>_> obj;
  Resources res;
  Environment env;
  VkBufferViewCreateInfo local_130;
  undefined4 local_f8;
  undefined4 uStack_f4;
  Deleter<vk::Handle<(vk::HandleType)12>_> DStack_f0;
  Move<vk::Handle<(vk::HandleType)12>_> local_d8;
  Resources local_b0;
  Environment local_60;
  
  local_60.vkp = context->m_platformInterface;
  local_60.vkd = Context::getDeviceInterface(context);
  local_60.device = Context::getDevice(context);
  local_60.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_60.programBinaries = context->m_progCollection;
  local_60.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_60.maxResourceConsumers = 1;
  BufferView::Resources::Resources(&local_b0,&local_60,&params);
  local_130.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_130.pNext = (void *)0x0;
  local_130.flags = 0;
  local_130.buffer.m_internal =
       local_b0.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_130.format = params.format;
  local_130.offset = params.offset;
  local_130.range = params.range;
  ::vk::createBufferView
            (&local_d8,local_60.vkd,local_60.device,&local_130,local_60.allocationCallbacks);
  local_f8 = (undefined4)
             local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  uStack_f4 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal._4_4_
  ;
  DStack_f0.m_deviceIface._0_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_f0.m_deviceIface._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface._4_4_;
  DStack_f0.m_device =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  DStack_f0.m_allocator =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  obj_00.m_internal._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal._4_4_;
  obj_00.m_internal._0_4_ =
       (undefined4)local_d8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()(&DStack_f0,obj_00);
  }
  local_130._0_8_ = (void *)((long)&local_130 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_130._0_8_,
             (long)local_130.pNext + local_130._0_8_);
  if ((void *)local_130._0_8_ != (void *)((long)&local_130 + 0x10U)) {
    operator_delete((void *)local_130._0_8_,CONCAT44(local_130._20_4_,local_130.flags) + 1);
  }
  if (local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
               m_internal);
  }
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_b0.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (local_b0.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_b0.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_b0.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}